

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::GetFullNameInternal
          (cmGeneratorTarget *this,string *config,ArtifactType artifact,string *outPrefix,
          string *outBase,string *outSuffix)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TargetType TVar2;
  cmMakefile *pcVar3;
  pointer pcVar4;
  ArtifactType artifact_00;
  bool bVar5;
  char *pcVar6;
  _Alloc_hider __s;
  char *pcVar7;
  char *__s_00;
  LinkClosure *pLVar8;
  long *plVar9;
  size_t sVar10;
  string *psVar11;
  size_type *psVar12;
  ulong *puVar13;
  string fw_prefix;
  string ll;
  size_type __dnew_1;
  string local_e8;
  string local_c8;
  string local_a8;
  ArtifactType local_84;
  string *local_80;
  string *local_78;
  undefined2 *local_70;
  undefined8 local_68;
  undefined2 local_60;
  undefined6 uStack_5e;
  ArtifactType local_4c;
  char *local_48;
  string *local_40;
  string *local_38;
  
  TVar2 = this->Target->TargetTypeValue;
  if (TVar2 < OBJECT_LIBRARY) {
    paVar1 = &local_c8.field_2;
    local_c8._M_dataplus._M_p = (pointer)paVar1;
    local_80 = outBase;
    local_78 = config;
    local_4c = artifact;
    local_40 = outSuffix;
    local_38 = outPrefix;
    if (artifact == ImportLibraryArtifact) {
      pcVar3 = this->Makefile;
      local_e8._M_dataplus._M_p = (pointer)0x1b;
      local_c8._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_c8,(ulong)&local_e8);
      local_c8.field_2._M_allocated_capacity._0_4_ = SUB84(local_e8._M_dataplus._M_p,0);
      local_c8.field_2._M_local_buf[4] = (char)((ulong)local_e8._M_dataplus._M_p >> 0x20);
      local_c8.field_2._M_local_buf[5] = (char)((ulong)local_e8._M_dataplus._M_p >> 0x28);
      local_c8.field_2._M_local_buf[6] = (char)((ulong)local_e8._M_dataplus._M_p >> 0x30);
      local_c8.field_2._M_local_buf[7] = (char)((ulong)local_e8._M_dataplus._M_p >> 0x38);
      builtin_strncpy(local_c8._M_dataplus._M_p,"CMAKE_IMPORT_LIBRARY_SUFFIX",0x1b);
      local_c8._M_string_length = (size_type)local_e8._M_dataplus._M_p;
      local_c8._M_dataplus._M_p[(long)local_e8._M_dataplus._M_p] = '\0';
      pcVar6 = cmMakefile::GetDefinition(pcVar3,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8._M_dataplus._M_p,
                        CONCAT17(local_c8.field_2._M_local_buf[7],
                                 CONCAT16(local_c8.field_2._M_local_buf[6],
                                          CONCAT15(local_c8.field_2._M_local_buf[5],
                                                   CONCAT14(local_c8.field_2._M_local_buf[4],
                                                            local_c8.field_2._M_allocated_capacity.
                                                            _0_4_)))) + 1);
      }
      if (pcVar6 == (char *)0x0) {
        local_38->_M_string_length = 0;
        *(local_38->_M_dataplus)._M_p = '\0';
        local_80->_M_string_length = 0;
        *(local_80->_M_dataplus)._M_p = '\0';
        outSuffix->_M_string_length = 0;
        *(outSuffix->_M_dataplus)._M_p = '\0';
        return;
      }
      TVar2 = this->Target->TargetTypeValue;
      local_c8.field_2._M_allocated_capacity._0_4_ = 0x4f504d49;
      local_c8.field_2._M_local_buf[4] = 'R';
      local_c8.field_2._M_local_buf[5] = 'T';
      local_c8.field_2._M_local_buf[6] = '_';
      local_c8.field_2._M_local_buf[7] = 'P';
      local_c8.field_2._8_5_ = 0x5849464552;
      local_c8._M_string_length = 0xd;
      local_c8.field_2._M_local_buf[0xd] = '\0';
      local_c8._M_dataplus._M_p = (pointer)paVar1;
      __s._M_p = GetProperty(this,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8._M_dataplus._M_p,
                        CONCAT17(local_c8.field_2._M_local_buf[7],
                                 CONCAT16(local_c8.field_2._M_local_buf[6],
                                          CONCAT15(local_c8.field_2._M_local_buf[5],
                                                   CONCAT14(local_c8.field_2._M_local_buf[4],
                                                            local_c8.field_2._M_allocated_capacity.
                                                            _0_4_)))) + 1);
      }
      local_c8.field_2._M_allocated_capacity._0_4_ = 0x4f504d49;
      local_c8.field_2._M_local_buf[4] = 'R';
      local_c8.field_2._M_local_buf[5] = 'T';
      local_c8.field_2._M_local_buf[6] = '_';
      local_c8.field_2._M_local_buf[7] = 'S';
      local_c8.field_2._8_5_ = 0x5849464655;
      local_c8._M_string_length = 0xd;
      local_c8.field_2._M_local_buf[0xd] = '\0';
      local_c8._M_dataplus._M_p = (pointer)paVar1;
      pcVar6 = GetProperty(this,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8._M_dataplus._M_p,
                        CONCAT17(local_c8.field_2._M_local_buf[7],
                                 CONCAT16(local_c8.field_2._M_local_buf[6],
                                          CONCAT15(local_c8.field_2._M_local_buf[5],
                                                   CONCAT14(local_c8.field_2._M_local_buf[4],
                                                            local_c8.field_2._M_allocated_capacity.
                                                            _0_4_)))) + 1);
      }
      local_84 = (ArtifactType)(TVar2 == EXECUTABLE || (TVar2 & ~STATIC_LIBRARY) == SHARED_LIBRARY);
      config = local_78;
    }
    else {
      local_84 = RuntimeBinaryArtifact;
      if (TVar2 != STATIC_LIBRARY) {
        local_84 = artifact;
      }
      local_c8.field_2._M_allocated_capacity._0_4_ = 0x46455250;
      local_c8.field_2._M_local_buf[4] = 'I';
      local_c8.field_2._M_local_buf[5] = 'X';
      local_c8._M_string_length = 6;
      local_c8.field_2._M_local_buf[6] = '\0';
      __s._M_p = GetProperty(this,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8._M_dataplus._M_p,
                        CONCAT17(local_c8.field_2._M_local_buf[7],
                                 CONCAT16(local_c8.field_2._M_local_buf[6],
                                          CONCAT15(local_c8.field_2._M_local_buf[5],
                                                   CONCAT14(local_c8.field_2._M_local_buf[4],
                                                            local_c8.field_2._M_allocated_capacity.
                                                            _0_4_)))) + 1);
      }
      local_c8.field_2._M_allocated_capacity._0_4_ = 0x46465553;
      local_c8.field_2._M_local_buf[4] = 'I';
      local_c8.field_2._M_local_buf[5] = 'X';
      local_c8._M_string_length = 6;
      local_c8.field_2._M_local_buf[6] = '\0';
      local_c8._M_dataplus._M_p = (pointer)paVar1;
      pcVar6 = GetProperty(this,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8._M_dataplus._M_p,
                        CONCAT17(local_c8.field_2._M_local_buf[7],
                                 CONCAT16(local_c8.field_2._M_local_buf[6],
                                          CONCAT15(local_c8.field_2._M_local_buf[5],
                                                   CONCAT14(local_c8.field_2._M_local_buf[4],
                                                            local_c8.field_2._M_allocated_capacity.
                                                            _0_4_)))) + 1);
      }
    }
    if (config->_M_string_length == 0) {
      local_48 = (char *)0x0;
    }
    else {
      cmsys::SystemTools::UpperCase(&local_c8,config);
      std::__cxx11::string::append((char *)&local_c8);
      pcVar7 = GetProperty(this,&local_c8);
      if (((pcVar7 == (char *)0x0) || (bVar5 = IsAppBundleOnApple(this), bVar5)) ||
         (bVar5 = IsFrameworkOnApple(this), bVar5)) {
        pcVar7 = (char *)0x0;
      }
      local_48 = pcVar7;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8._M_dataplus._M_p,
                        CONCAT17(local_c8.field_2._M_local_buf[7],
                                 CONCAT16(local_c8.field_2._M_local_buf[6],
                                          CONCAT15(local_c8.field_2._M_local_buf[5],
                                                   CONCAT14(local_c8.field_2._M_local_buf[4],
                                                            local_c8.field_2._M_allocated_capacity.
                                                            _0_4_)))) + 1);
      }
    }
    artifact_00 = local_84;
    pcVar7 = cmTarget::GetPrefixVariableInternal(this->Target,local_84);
    __s_00 = cmTarget::GetSuffixVariableInternal(this->Target,artifact_00);
    pLVar8 = GetLinkClosure(this,local_78);
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    pcVar4 = (pLVar8->LinkerLanguage)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar4,pcVar4 + (pLVar8->LinkerLanguage)._M_string_length);
    if (local_c8._M_string_length != 0) {
      if ((pcVar6 == (char *)0x0) && (__s_00 != (char *)0x0)) {
        if (*__s_00 == '\0') {
          pcVar6 = (char *)0x0;
        }
        else {
          local_70 = &local_60;
          local_60 = 0x5f;
          local_68 = 1;
          strlen(__s_00);
          plVar9 = (long *)std::__cxx11::string::replace
                                     ((ulong)&local_70,0,(char *)0x0,(ulong)__s_00);
          psVar12 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_a8.field_2._M_allocated_capacity = *psVar12;
            local_a8.field_2._8_8_ = plVar9[3];
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          }
          else {
            local_a8.field_2._M_allocated_capacity = *psVar12;
            local_a8._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_a8._M_string_length = plVar9[1];
          *plVar9 = (long)psVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_a8,(ulong)local_c8._M_dataplus._M_p);
          puVar13 = (ulong *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_e8.field_2._M_allocated_capacity = *puVar13;
            local_e8.field_2._8_8_ = plVar9[3];
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          }
          else {
            local_e8.field_2._M_allocated_capacity = *puVar13;
            local_e8._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_e8._M_string_length = plVar9[1];
          *plVar9 = (long)puVar13;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          if (local_70 != &local_60) {
            operator_delete(local_70,CONCAT62(uStack_5e,local_60) + 1);
          }
          pcVar6 = cmMakefile::GetDefinition(this->Makefile,&local_e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
        }
      }
      if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)__s._M_p ==
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0) && (pcVar7 != (char *)0x0)) {
        if (*pcVar7 == '\0') {
          __s._M_p = (pointer)0x0;
        }
        else {
          local_70 = &local_60;
          local_60 = 0x5f;
          local_68 = 1;
          strlen(pcVar7);
          plVar9 = (long *)std::__cxx11::string::replace
                                     ((ulong)&local_70,0,(char *)0x0,(ulong)pcVar7);
          psVar12 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_a8.field_2._M_allocated_capacity = *psVar12;
            local_a8.field_2._8_8_ = plVar9[3];
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          }
          else {
            local_a8.field_2._M_allocated_capacity = *psVar12;
            local_a8._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_a8._M_string_length = plVar9[1];
          *plVar9 = (long)psVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_a8,(ulong)local_c8._M_dataplus._M_p);
          puVar13 = (ulong *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_e8.field_2._M_allocated_capacity = *puVar13;
            local_e8.field_2._8_8_ = plVar9[3];
            local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          }
          else {
            local_e8.field_2._M_allocated_capacity = *puVar13;
            local_e8._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_e8._M_string_length = plVar9[1];
          *plVar9 = (long)puVar13;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          if (local_70 != &local_60) {
            operator_delete(local_70,CONCAT62(uStack_5e,local_60) + 1);
          }
          __s._M_p = cmMakefile::GetDefinition(this->Makefile,&local_e8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
        }
      }
    }
    if ((pcVar7 != (char *)0x0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__s._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0)) {
      pcVar3 = this->Makefile;
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      sVar10 = strlen(pcVar7);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,pcVar7,pcVar7 + sVar10);
      psVar11 = cmMakefile::GetSafeDefinition(pcVar3,&local_e8);
      __s._M_p = (psVar11->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
    }
    if ((__s_00 != (char *)0x0) && (pcVar6 == (char *)0x0)) {
      pcVar3 = this->Makefile;
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      sVar10 = strlen(__s_00);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,__s_00,__s_00 + sVar10);
      psVar11 = cmMakefile::GetSafeDefinition(pcVar3,&local_e8);
      pcVar6 = (psVar11->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
    }
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    local_e8._M_string_length = 0;
    local_e8.field_2._M_allocated_capacity =
         local_e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    bVar5 = IsFrameworkOnApple(this);
    if (bVar5) {
      GetFrameworkDirectory(&local_a8,this,local_78,ContentLevel);
      std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)&local_e8);
      pcVar6 = (char *)0x0;
      __s._M_p = local_e8._M_dataplus._M_p;
    }
    bVar5 = IsCFBundleOnApple(this);
    if (bVar5) {
      GetCFBundleDirectory(&local_a8,this,local_78,FullLevel);
      std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)&local_e8);
      pcVar6 = (char *)0x0;
      __s._M_p = local_e8._M_dataplus._M_p;
    }
    psVar11 = local_38;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__s._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      __s._M_p = "";
    }
    pcVar7 = (char *)local_38->_M_string_length;
    strlen(__s._M_p);
    std::__cxx11::string::_M_replace((ulong)psVar11,0,pcVar7,(ulong)__s._M_p);
    GetOutputName(&local_a8,this,local_78,local_84);
    std::__cxx11::string::_M_append((char *)local_80,(ulong)local_a8._M_dataplus._M_p);
    paVar1 = &local_a8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)local_80);
    local_a8.field_2._M_allocated_capacity = 0x4f49535245564f53;
    local_a8.field_2._8_2_ = 0x4e;
    local_a8._M_string_length = 9;
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    pcVar7 = GetProperty(this,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (((pcVar7 != (char *)0x0) && (local_4c != ImportLibraryArtifact)) &&
       (this->Target->TargetTypeValue == SHARED_LIBRARY)) {
      pcVar3 = this->Makefile;
      local_70 = (undefined2 *)0x26;
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      local_a8._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_a8,(ulong)&local_70);
      local_a8.field_2._M_allocated_capacity = (size_type)local_70;
      *(undefined8 *)((long)local_a8._M_dataplus._M_p + 0x10) = 0x4d414e5f59524152;
      *(undefined8 *)((long)local_a8._M_dataplus._M_p + 0x18) = 0x565f485449575f45;
      *(undefined8 *)local_a8._M_dataplus._M_p = 0x48535f454b414d43;
      *(undefined8 *)((long)local_a8._M_dataplus._M_p + 8) = 0x42494c5f44455241;
      builtin_strncpy((char *)((long)local_a8._M_dataplus._M_p + 0x1e),"_VERSION",8);
      local_a8._M_string_length = (size_type)local_70;
      local_a8._M_dataplus._M_p[(long)local_70] = '\0';
      bVar5 = cmMakefile::IsOn(pcVar3,&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if (bVar5) {
        std::__cxx11::string::append((char *)local_80);
        std::__cxx11::string::append((char *)local_80);
      }
    }
    psVar11 = local_40;
    pcVar7 = "";
    if (pcVar6 != (char *)0x0) {
      pcVar7 = pcVar6;
    }
    pcVar6 = (char *)local_40->_M_string_length;
    strlen(pcVar7);
    std::__cxx11::string::_M_replace((ulong)psVar11,0,pcVar6,(ulong)pcVar7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,
                      CONCAT17(local_c8.field_2._M_local_buf[7],
                               CONCAT16(local_c8.field_2._M_local_buf[6],
                                        CONCAT15(local_c8.field_2._M_local_buf[5],
                                                 CONCAT14(local_c8.field_2._M_local_buf[4],
                                                          local_c8.field_2._M_allocated_capacity.
                                                          _0_4_)))) + 1);
    }
  }
  else {
    outPrefix->_M_string_length = 0;
    *(outPrefix->_M_dataplus)._M_p = '\0';
    std::__cxx11::string::_M_assign((string *)outBase);
    outSuffix->_M_string_length = 0;
    *(outSuffix->_M_dataplus)._M_p = '\0';
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetFullNameInternal(
  const std::string& config, cmStateEnums::ArtifactType artifact,
  std::string& outPrefix, std::string& outBase, std::string& outSuffix) const
{
  // Use just the target name for non-main target types.
  if (this->GetType() != cmStateEnums::STATIC_LIBRARY &&
      this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    outPrefix.clear();
    outBase = this->GetName();
    outSuffix.clear();
    return;
  }

  const bool isImportedLibraryArtifact =
    (artifact == cmStateEnums::ImportLibraryArtifact);

  // Return an empty name for the import library if this platform
  // does not support import libraries.
  if (isImportedLibraryArtifact &&
      !this->Makefile->GetDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX")) {
    outPrefix.clear();
    outBase.clear();
    outSuffix.clear();
    return;
  }

  // The implib option is only allowed for shared libraries, module
  // libraries, and executables.
  if (this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    artifact = cmStateEnums::RuntimeBinaryArtifact;
  }

  // Compute the full name for main target types.
  const char* targetPrefix =
    (isImportedLibraryArtifact ? this->GetProperty("IMPORT_PREFIX")
                               : this->GetProperty("PREFIX"));
  const char* targetSuffix =
    (isImportedLibraryArtifact ? this->GetProperty("IMPORT_SUFFIX")
                               : this->GetProperty("SUFFIX"));
  const char* configPostfix = nullptr;
  if (!config.empty()) {
    std::string configProp = cmSystemTools::UpperCase(config);
    configProp += "_POSTFIX";
    configPostfix = this->GetProperty(configProp);
    // Mac application bundles and frameworks have no postfix.
    if (configPostfix &&
        (this->IsAppBundleOnApple() || this->IsFrameworkOnApple())) {
      configPostfix = nullptr;
    }
  }
  const char* prefixVar = this->Target->GetPrefixVariableInternal(artifact);
  const char* suffixVar = this->Target->GetSuffixVariableInternal(artifact);

  // Check for language-specific default prefix and suffix.
  std::string ll = this->GetLinkerLanguage(config);
  if (!ll.empty()) {
    if (!targetSuffix && suffixVar && *suffixVar) {
      std::string langSuff = suffixVar + std::string("_") + ll;
      targetSuffix = this->Makefile->GetDefinition(langSuff);
    }
    if (!targetPrefix && prefixVar && *prefixVar) {
      std::string langPrefix = prefixVar + std::string("_") + ll;
      targetPrefix = this->Makefile->GetDefinition(langPrefix);
    }
  }

  // if there is no prefix on the target use the cmake definition
  if (!targetPrefix && prefixVar) {
    targetPrefix = this->Makefile->GetSafeDefinition(prefixVar).c_str();
  }
  // if there is no suffix on the target use the cmake definition
  if (!targetSuffix && suffixVar) {
    targetSuffix = this->Makefile->GetSafeDefinition(suffixVar).c_str();
  }

  // frameworks have directory prefix but no suffix
  std::string fw_prefix;
  if (this->IsFrameworkOnApple()) {
    fw_prefix = this->GetFrameworkDirectory(config, ContentLevel);
    fw_prefix += "/";
    targetPrefix = fw_prefix.c_str();
    targetSuffix = nullptr;
  }

  if (this->IsCFBundleOnApple()) {
    fw_prefix = this->GetCFBundleDirectory(config, FullLevel);
    fw_prefix += "/";
    targetPrefix = fw_prefix.c_str();
    targetSuffix = nullptr;
  }

  // Begin the final name with the prefix.
  outPrefix = targetPrefix ? targetPrefix : "";

  // Append the target name or property-specified name.
  outBase += this->GetOutputName(config, artifact);

  // Append the per-configuration postfix.
  outBase += configPostfix ? configPostfix : "";

  // Name shared libraries with their version number on some platforms.
  if (const char* soversion = this->GetProperty("SOVERSION")) {
    if (this->GetType() == cmStateEnums::SHARED_LIBRARY &&
        !isImportedLibraryArtifact &&
        this->Makefile->IsOn("CMAKE_SHARED_LIBRARY_NAME_WITH_VERSION")) {
      outBase += "-";
      outBase += soversion;
    }
  }

  // Append the suffix.
  outSuffix = targetSuffix ? targetSuffix : "";
}